

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O2

shared_ptr<gui::Style> __thiscall
gui::DefaultTheme::loadStyle(DefaultTheme *this,String *widgetName)

{
  bool bVar1;
  String *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<gui::Style> sVar3;
  locale local_50 [8];
  _Alloc_hider local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  
  std::locale::locale(local_50);
  sf::String::String((String *)&stack0xffffffffffffffb8,"Button",local_50);
  bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&stack0xffffffffffffffb8);
  std::locale::~locale(local_50);
  if (bVar1) {
    makeButtonStyle((DefaultTheme *)&stack0xffffffffffffffb8);
  }
  else {
    std::locale::locale(local_50);
    sf::String::String((String *)&stack0xffffffffffffffb8,"ChatBox",local_50);
    bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&stack0xffffffffffffffb8);
    std::locale::~locale(local_50);
    if (bVar1) {
      makeChatBoxStyle((DefaultTheme *)&stack0xffffffffffffffb8);
    }
    else {
      std::locale::locale(local_50);
      sf::String::String((String *)&stack0xffffffffffffffb8,"CheckBox",local_50);
      bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
      std::__cxx11::
      basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
      ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&stack0xffffffffffffffb8);
      std::locale::~locale(local_50);
      if (bVar1) {
        makeCheckBoxStyle((DefaultTheme *)&stack0xffffffffffffffb8);
      }
      else {
        std::locale::locale(local_50);
        sf::String::String((String *)&stack0xffffffffffffffb8,"ColorPicker",local_50);
        bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
        std::__cxx11::
        basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
        ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&stack0xffffffffffffffb8);
        std::locale::~locale(local_50);
        if (bVar1) {
          makeColorPickerStyle((DefaultTheme *)&stack0xffffffffffffffb8);
        }
        else {
          std::locale::locale(local_50);
          sf::String::String((String *)&stack0xffffffffffffffb8,"DialogBox",local_50);
          bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
          std::__cxx11::
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&stack0xffffffffffffffb8);
          std::locale::~locale(local_50);
          if (bVar1) {
            makeDialogBoxStyle((DefaultTheme *)&stack0xffffffffffffffb8);
          }
          else {
            std::locale::locale(local_50);
            sf::String::String((String *)&stack0xffffffffffffffb8,"Label",local_50);
            bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
            std::__cxx11::
            basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&stack0xffffffffffffffb8);
            std::locale::~locale(local_50);
            if (bVar1) {
              makeLabelStyle((DefaultTheme *)&stack0xffffffffffffffb8);
            }
            else {
              std::locale::locale(local_50);
              sf::String::String((String *)&stack0xffffffffffffffb8,"MenuBar",local_50);
              bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
              std::__cxx11::
              basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)&stack0xffffffffffffffb8);
              std::locale::~locale(local_50);
              if (bVar1) {
                makeMenuBarStyle((DefaultTheme *)&stack0xffffffffffffffb8);
              }
              else {
                std::locale::locale(local_50);
                sf::String::String((String *)&stack0xffffffffffffffb8,"MultilineTextBox",local_50);
                bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
                std::__cxx11::
                basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&stack0xffffffffffffffb8);
                std::locale::~locale(local_50);
                if (bVar1) {
                  makeMultilineTextBoxStyle((DefaultTheme *)&stack0xffffffffffffffb8);
                }
                else {
                  std::locale::locale(local_50);
                  sf::String::String((String *)&stack0xffffffffffffffb8,"Panel",local_50);
                  bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
                  std::__cxx11::
                  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&stack0xffffffffffffffb8);
                  std::locale::~locale(local_50);
                  if (bVar1) {
                    makePanelStyle((DefaultTheme *)&stack0xffffffffffffffb8);
                  }
                  else {
                    std::locale::locale(local_50);
                    sf::String::String((String *)&stack0xffffffffffffffb8,"RadioButton",local_50);
                    bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
                    std::__cxx11::
                    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)&stack0xffffffffffffffb8);
                    std::locale::~locale(local_50);
                    if (bVar1) {
                      makeRadioButtonStyle((DefaultTheme *)&stack0xffffffffffffffb8);
                    }
                    else {
                      std::locale::locale(local_50);
                      sf::String::String((String *)&stack0xffffffffffffffb8,"Slider",local_50);
                      bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
                      std::__cxx11::
                      basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                                       *)&stack0xffffffffffffffb8);
                      std::locale::~locale(local_50);
                      if (bVar1) {
                        makeSliderStyle((DefaultTheme *)&stack0xffffffffffffffb8);
                      }
                      else {
                        std::locale::locale(local_50);
                        sf::String::String((String *)&stack0xffffffffffffffb8,"TextBox",local_50);
                        bVar1 = sf::operator==(in_RDX,(String *)&stack0xffffffffffffffb8);
                        std::__cxx11::
                        basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                        ::~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                                         *)&stack0xffffffffffffffb8);
                        std::locale::~locale(local_50);
                        if (!bVar1) {
                          (this->super_Theme)._vptr_Theme = (_func_int **)0x0;
                          (this->super_Theme).gui_ = (Gui *)0x0;
                          _Var2._M_pi = extraout_RDX;
                          goto LAB_0012aec5;
                        }
                        makeTextBoxStyle((DefaultTheme *)&stack0xffffffffffffffb8);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  _Var2._M_pi = _Stack_40._M_pi;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Theme)._vptr_Theme = (_func_int **)local_48._M_p;
  (this->super_Theme).gui_ = (Gui *)_Var2._M_pi;
  local_48._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffc0);
  _Var2._M_pi = extraout_RDX_00;
LAB_0012aec5:
  sVar3.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<gui::Style>)sVar3.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Style> DefaultTheme::loadStyle(const sf::String& widgetName) const {
    GUI_DEBUG << "Loading style for \"" << widgetName.toAnsiString() << "\".\n";
    if (widgetName == "Button") {
        return makeButtonStyle();
    } else if (widgetName == "ChatBox") {
        return makeChatBoxStyle();
    } else if (widgetName == "CheckBox") {
        return makeCheckBoxStyle();
    } else if (widgetName == "ColorPicker") {
        return makeColorPickerStyle();
    } else if (widgetName == "DialogBox") {
        return makeDialogBoxStyle();
    } else if (widgetName == "Label") {
        return makeLabelStyle();
    } else if (widgetName == "MenuBar") {
        return makeMenuBarStyle();
    } else if (widgetName == "MultilineTextBox") {
        return makeMultilineTextBoxStyle();
    } else if (widgetName == "Panel") {
        return makePanelStyle();
    } else if (widgetName == "RadioButton") {
        return makeRadioButtonStyle();
    } else if (widgetName == "Slider") {
        return makeSliderStyle();
    } else if (widgetName == "TextBox") {
        return makeTextBoxStyle();
    }

    // Normally if we don't find the widget, then fall back to the base class
    // version. In this case the base class doesn't implement it though.
    //return Theme::loadStyle(widgetName);
    return nullptr;
}